

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MyTypeForTesting expectedObject;
  MyTypeForTestingCopier copier;
  MockExpectedParameterDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_d9;
  SimpleString local_d8;
  SimpleString local_c8;
  MockExpectedCallsList local_b8;
  MyTypeForTesting local_a8;
  SimpleString local_98;
  SimpleString local_88;
  undefined **local_78;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_d9);
  MyTypeForTesting::MyTypeForTesting(&local_a8,0x1e248);
  local_78 = &PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString((SimpleString *)&local_70,"");
  pMVar2 = mock((SimpleString *)&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_b8,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_b8,&local_78);
  SimpleString::~SimpleString((SimpleString *)&local_b8);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_b8);
  SimpleString::SimpleString((SimpleString *)&local_70,"foo");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_b8,(SimpleString *)&local_70);
  SimpleString::SimpleString(&local_d8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_c8,"output");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[7])
            (pMVar3,&local_d8,&local_c8,&local_a8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_d8,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)&local_70,test,&local_d8,&local_b8,&local_b8
            );
  SimpleString::~SimpleString(&local_d8);
  SimpleString::SimpleString(&local_d8,"");
  pMVar2 = mock(&local_d8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_c8);
  SimpleString::SimpleString(&local_88,"MyTypeForTesting");
  SimpleString::SimpleString(&local_98,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_88,&local_98,&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::SimpleString(&local_d8,"");
  pMVar2 = mock(&local_d8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c8,"foo");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_c8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::SimpleString(&local_d8,"");
  pMVar2 = mock(&local_d8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_d8);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0xee);
  SimpleString::SimpleString(&local_d8,"");
  pMVar2 = mock(&local_d8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_d8);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_b8);
  MyTypeForTesting::~MyTypeForTesting(&local_a8);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_d9);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterMissing)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}